

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stmt.cc
# Opt level: O0

void __thiscall
kratos::ModuleInstantiationStmt::ModuleInstantiationStmt
          (ModuleInstantiationStmt *this,Generator *target,Generator *parent)

{
  bool bVar1;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *this_00;
  element_type *port_00;
  bool *pbVar2;
  element_type *port;
  undefined1 local_60 [8];
  shared_ptr<kratos::Port> *port_shared;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *port_name;
  iterator __end1;
  iterator __begin1;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range1;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *port_names;
  Generator *parent_local;
  Generator *target_local;
  ModuleInstantiationStmt *this_local;
  
  Stmt::Stmt(&this->super_Stmt,ModuleInstantiation);
  InstantiationStmt::InstantiationStmt(&this->super_InstantiationStmt);
  (this->super_Stmt).super_IRNode._vptr_IRNode = (_func_int **)&PTR_accept_005c8dc8;
  (this->super_InstantiationStmt)._vptr_InstantiationStmt =
       (_func_int **)&PTR_instantiation_type_005c8e48;
  this->target_ = target;
  this_00 = Generator::get_port_names_abi_cxx11_(target);
  __end1 = std::
           set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::begin(this_00);
  port_name = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
              std::
              set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::end(this_00);
  while( true ) {
    bVar1 = std::operator!=(&__end1,(_Self *)&port_name);
    if (!bVar1) break;
    port_shared = (shared_ptr<kratos::Port> *)
                  std::
                  _Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  ::operator*(&__end1);
    Generator::get_port((Generator *)&port,(string *)target);
    local_60 = (undefined1  [8])&port;
    port_00 = std::__shared_ptr<kratos::Port,_(__gnu_cxx::_Lock_policy)2>::get
                        ((__shared_ptr<kratos::Port,_(__gnu_cxx::_Lock_policy)2> *)local_60);
    InstantiationStmt::process_port(&this->super_InstantiationStmt,port_00,parent,&target->name);
    std::shared_ptr<kratos::Port>::~shared_ptr((shared_ptr<kratos::Port> *)&port);
    std::
    _Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator++(&__end1);
  }
  pbVar2 = Generator::has_instantiated(target);
  *pbVar2 = true;
  return;
}

Assistant:

ModuleInstantiationStmt::ModuleInstantiationStmt(Generator *target, Generator *parent)
    : Stmt(StatementType::ModuleInstantiation), target_(target) {
    auto const &port_names = target->get_port_names();
    for (auto const &port_name : port_names) {
        auto const &port_shared = target->get_port(port_name);
        auto *port = port_shared.get();
        process_port(port, parent, target->name);
    }
    target->has_instantiated() = true;
}